

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_mqtt_common.c
# Opt level: O0

int InternStrnicmp(char *s1,char *s2,size_t n)

{
  size_t sVar1;
  int local_34;
  int local_2c;
  int local_24;
  size_t sStack_20;
  int result;
  size_t n_local;
  char *s2_local;
  char *s1_local;
  
  if (s1 == (char *)0x0) {
    local_24 = -1;
  }
  else if (s2 == (char *)0x0) {
    local_24 = 1;
  }
  else {
    local_24 = 0;
    sStack_20 = n;
    n_local = (size_t)s2;
    s2_local = s1;
    while (sVar1 = sStack_20 - 1, sStack_20 != 0 && local_24 == 0) {
      sStack_20 = sVar1;
      if (*s2_local == '\0') {
        local_24 = -1;
      }
      else if (*(char *)n_local == '\0') {
        local_24 = 1;
      }
      else {
        if ((*s2_local < 'A') || ('Z' < *s2_local)) {
          local_2c = (int)*s2_local;
        }
        else {
          local_2c = *s2_local + 0x20;
        }
        if ((*(char *)n_local < 'A') || ('Z' < *(char *)n_local)) {
          local_34 = (int)*(char *)n_local;
        }
        else {
          local_34 = *(char *)n_local + 0x20;
        }
        local_24 = local_2c - local_34;
        s2_local = s2_local + 1;
        n_local = n_local + 1;
      }
    }
  }
  return local_24;
}

Assistant:

static int InternStrnicmp(const char* s1, const char* s2, size_t n)
{
    int result;

    if (s1 == NULL)
    {
        result = -1;
    }
    else if (s2 == NULL)
    {
        result = 1;
    }
    else
    {
        result = 0;

        while (n-- && result == 0)
        {
            if (*s1 == 0) result = -1;
            else if (*s2 == 0) result = 1;
            else
            {

                result = TOLOWER(*s1) - TOLOWER(*s2);
                ++s1;
                ++s2;
            }
        }
    }
    return result;
}